

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:38:21)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:38:21)>
          *this,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  ParserResult result;
  string local_108;
  string local_e8 [32];
  ParserResult local_c8;
  SessionSettings local_98;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  convertInto(&local_c8,arg,&local_108);
  if (local_c8.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type == Ok) {
    std::__cxx11::string::string(local_e8,(string *)&local_108);
    FIX::SessionSettings::SessionSettings(&local_98,local_e8,false);
    FIX::SessionSettings::operator=((SessionSettings *)FIX::TestSettings::sessionSettings,&local_98)
    ;
    FIX::SessionSettings::~SessionSettings(&local_98);
    std::__cxx11::string::~string(local_e8);
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f3d40;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    BasicResult<Catch::Clara::ParseResultType>::BasicResult(__return_storage_ptr__,&local_c8);
  }
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }